

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O0

SentencePieceNormalizer * __thiscall
sentencepiece::SentencePieceNormalizer::Normalize
          (SentencePieceNormalizer *this,string_view input,string *normalized)

{
  bool bVar1;
  StatusBuilder *pSVar2;
  pointer pNVar3;
  string *psVar4;
  undefined8 in_R8;
  undefined1 local_1d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> norm_to_orig;
  StatusBuilder local_1b0;
  undefined8 local_30;
  string *normalized_local;
  SentencePieceNormalizer *this_local;
  string_view input_local;
  
  this_local = (SentencePieceNormalizer *)input._M_str;
  psVar4 = (string *)input._M_len;
  local_30 = in_R8;
  normalized_local = psVar4;
  input_local._M_len = (size_t)normalized;
  input_local._M_str = (char *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&psVar4->_M_string_length);
  if (bVar1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1d8);
    pNVar3 = std::
             unique_ptr<sentencepiece::normalizer::Normalizer,_std::default_delete<sentencepiece::normalizer::Normalizer>_>
             ::operator->((unique_ptr<sentencepiece::normalizer::Normalizer,_std::default_delete<sentencepiece::normalizer::Normalizer>_>
                           *)&psVar4->_M_string_length);
    (**(code **)(*(long *)pNVar3 + 0x20))
              (this,pNVar3,this_local,input_local._M_len,local_30,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1d8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1d8);
  }
  else {
    util::StatusBuilder::StatusBuilder(&local_1b0,kInternal);
    pSVar2 = util::StatusBuilder::operator<<
                       (&local_1b0,(char (*) [29])"src/sentencepiece_trainer.cc");
    pSVar2 = util::StatusBuilder::operator<<(pSVar2,(char (*) [2])0x3a86b0);
    norm_to_orig.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0x157;
    pSVar2 = util::StatusBuilder::operator<<
                       (pSVar2,(int *)&norm_to_orig.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar2 = util::StatusBuilder::operator<<(pSVar2,(char (*) [4])") [");
    pSVar2 = util::StatusBuilder::operator<<(pSVar2,(char (*) [12])"normalizer_");
    util::StatusBuilder::operator<<(pSVar2,(char (*) [3])"] ");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    util::StatusBuilder::~StatusBuilder(&local_1b0);
  }
  return this;
}

Assistant:

util::Status SentencePieceNormalizer::Normalize(absl::string_view input,
                                                std::string *normalized) const {
  CHECK_OR_RETURN(normalizer_);
  std::vector<size_t> norm_to_orig;
  return normalizer_->Normalize(input, normalized, &norm_to_orig);
}